

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O0

void lj_trace_reenableproto(GCproto *pt)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  GCproto *pGVar4;
  BCOp op;
  BCPos sizebc;
  BCPos i;
  BCIns *bc;
  GCproto *pt_local;
  
  if ((pt->flags & 0x10) != 0) {
    pGVar4 = pt + 1;
    uVar1 = pt->sizebc;
    pt->flags = pt->flags & 0xef;
    if (((pGVar4->nextgc).gcptr32 & 0xff) == 0x5a) {
      *(undefined1 *)&(pGVar4->nextgc).gcptr32 = 0x59;
    }
    for (i = 1; i < uVar1; i = i + 1) {
      uVar2 = (&pGVar4->nextgc)[i].gcptr32;
      uVar3 = uVar2 & 0xff;
      if (((uVar3 == 0x50) || (uVar3 == 0x53)) || (uVar3 == 0x56)) {
        *(char *)&(&pGVar4->nextgc)[i].gcptr32 = (char)uVar2 + -1;
      }
    }
  }
  return;
}

Assistant:

void lj_trace_reenableproto(GCproto *pt)
{
  if ((pt->flags & PROTO_ILOOP)) {
    BCIns *bc = proto_bc(pt);
    BCPos i, sizebc = pt->sizebc;
    pt->flags &= ~PROTO_ILOOP;
    if (bc_op(bc[0]) == BC_IFUNCF)
      setbc_op(&bc[0], BC_FUNCF);
    for (i = 1; i < sizebc; i++) {
      BCOp op = bc_op(bc[i]);
      if (op == BC_IFORL || op == BC_IITERL || op == BC_ILOOP)
	setbc_op(&bc[i], (int)op+(int)BC_LOOP-(int)BC_ILOOP);
    }
  }
}